

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_VariableNode *
getArgumentsVariableNode(UA_Server *server,UA_MethodNode *ofMethod,UA_String withBrowseName)

{
  bool bVar1;
  UA_Boolean UVar2;
  int iVar3;
  UA_NodeStoreEntry **ppUVar4;
  UA_VariableNode *pUVar5;
  UA_NodeId *nodeid;
  size_t sVar6;
  undefined1 local_60 [8];
  UA_NodeId hasProperty;
  UA_VariableNode *local_38;
  
  hasProperty.identifier.string.data = withBrowseName.data;
  local_60._0_2_ = 0;
  stack0xffffffffffffffa4 = 0x2e00000000;
  sVar6 = ofMethod->referencesSize;
  if (sVar6 != 0) {
    nodeid = &(ofMethod->references->targetId).nodeId;
    do {
      if ((nodeid[-1].identifier.guid.data4[0] == '\0') &&
         (UVar2 = UA_NodeId_equal((UA_NodeId *)local_60,
                                  (UA_NodeId *)((long)&nodeid[-2].identifier + 8)), UVar2)) {
        ppUVar4 = findNode(server->nodestore,nodeid);
        if (ppUVar4 == (UA_NodeStoreEntry **)0x0) {
          pUVar5 = (UA_VariableNode *)0x0;
        }
        else {
          pUVar5 = (UA_VariableNode *)&(*ppUVar4)->node;
        }
        if (pUVar5 == (UA_VariableNode *)0x0) {
          bVar1 = false;
        }
        else if ((((pUVar5->nodeClass == UA_NODECLASS_VARIABLE) &&
                  ((pUVar5->browseName).namespaceIndex == 0)) &&
                 ((pUVar5->browseName).name.length == withBrowseName.length)) &&
                (iVar3 = bcmp(hasProperty.identifier.string.data,(pUVar5->browseName).name.data,
                              withBrowseName.length), iVar3 == 0)) {
          bVar1 = true;
          local_38 = pUVar5;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) {
          return local_38;
        }
      }
      nodeid = (UA_NodeId *)&nodeid[3].identifier;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  return (UA_VariableNode *)0x0;
}

Assistant:

static const UA_VariableNode *
getArgumentsVariableNode(UA_Server *server, const UA_MethodNode *ofMethod,
                         UA_String withBrowseName) {
    UA_NodeId hasProperty = UA_NODEID_NUMERIC(0, UA_NS0ID_HASPROPERTY);
    for(size_t i = 0; i < ofMethod->referencesSize; ++i) {
        if(ofMethod->references[i].isInverse == false &&
            UA_NodeId_equal(&hasProperty, &ofMethod->references[i].referenceTypeId)) {
            const UA_Node *refTarget =
                UA_NodeStore_get(server->nodestore, &ofMethod->references[i].targetId.nodeId);
            if(!refTarget)
                continue;
            if(refTarget->nodeClass == UA_NODECLASS_VARIABLE &&
                refTarget->browseName.namespaceIndex == 0 &&
                UA_String_equal(&withBrowseName, &refTarget->browseName.name)) {
                return (const UA_VariableNode*) refTarget;
            }
        }
    }
    return NULL;
}